

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void nn_list_insert(nn_list *self,nn_list_item *item,nn_list_item *it)

{
  int iVar1;
  nn_list_item *in_RDX;
  nn_list_item *in_RSI;
  long *in_RDI;
  nn_list_item *local_20;
  
  iVar1 = nn_list_item_isinlist(in_RSI);
  if (iVar1 != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!nn_list_item_isinlist (item)",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/utils/list.c"
            ,0x4b);
    fflush(_stderr);
    nn_err_abort();
  }
  if (in_RDX == (nn_list_item *)0x0) {
    local_20 = (nn_list_item *)in_RDI[1];
  }
  else {
    local_20 = in_RDX->prev;
  }
  in_RSI->prev = local_20;
  in_RSI->next = in_RDX;
  if (in_RSI->prev != (nn_list_item *)0x0) {
    in_RSI->prev->next = in_RSI;
  }
  if (in_RSI->next != (nn_list_item *)0x0) {
    in_RSI->next->prev = in_RSI;
  }
  if ((*in_RDI == 0) || ((nn_list_item *)*in_RDI == in_RDX)) {
    *in_RDI = (long)in_RSI;
  }
  if (in_RDX == (nn_list_item *)0x0) {
    in_RDI[1] = (long)in_RSI;
  }
  return;
}

Assistant:

void nn_list_insert (struct nn_list *self, struct nn_list_item *item,
    struct nn_list_item *it)
{
    nn_assert (!nn_list_item_isinlist (item));

    item->prev = it ? it->prev : self->last;
    item->next = it;
    if (item->prev)
        item->prev->next = item;
    if (item->next)
        item->next->prev = item;
    if (!self->first || self->first == it)
        self->first = item;
    if (!it)
        self->last = item;
}